

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DRAMAddr.cpp
# Opt level: O3

string * __thiscall DRAMAddr::to_string_abi_cxx11_(string *__return_storage_ptr__,DRAMAddr *this)

{
  size_t sVar1;
  size_t sVar2;
  size_t sVar3;
  void *pvVar4;
  size_t sVar5;
  char local_438 [8];
  char buff [1024];
  
  sVar1 = this->bank;
  sVar2 = this->row;
  sVar3 = this->col;
  pvVar4 = to_virt(this);
  sprintf(local_438,"DRAMAddr(b: %zu, r: %zu, c: %zu) = %p",sVar1,sVar2,sVar3,pvVar4);
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  sVar5 = strlen(local_438);
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)__return_storage_ptr__,local_438,local_438 + sVar5);
  return __return_storage_ptr__;
}

Assistant:

std::string DRAMAddr::to_string() {
  char buff[1024];
  sprintf(buff, "DRAMAddr(b: %zu, r: %zu, c: %zu) = %p",
      this->bank,
      this->row,
      this->col,
      this->to_virt());
  return std::string(buff);
}